

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O0

void __thiscall
HandleInfoBase<XrGeometryInstanceFB_T_*,_GenValidUsageXrHandleInfo>::insert
          (HandleInfoBase<XrGeometryInstanceFB_T_*,_GenValidUsageXrHandleInfo> *this,
          XrGeometryInstanceFB_T *handle,
          unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
          *info)

{
  unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_> *puVar1;
  bool bVar2;
  mapped_type *this_00;
  allocator local_99;
  string local_98 [32];
  _Node_iterator_base<std::pair<XrGeometryInstanceFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
  local_78;
  _Node_iterator_base<std::pair<XrGeometryInstanceFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
  local_70;
  iterator entry_returned;
  UniqueLock lock;
  allocator local_41;
  string local_40 [32];
  unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_> *local_20;
  unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_> *info_local
  ;
  XrGeometryInstanceFB_T *handle_local;
  HandleInfoBase<XrGeometryInstanceFB_T_*,_GenValidUsageXrHandleInfo> *this_local;
  
  local_20 = info;
  info_local = (unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
                *)handle;
  handle_local = (XrGeometryInstanceFB_T *)this;
  if (handle == (XrGeometryInstanceFB_T *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,"Null handle passed to HandleInfoBase::insert()",&local_41);
    reportInternalError((string *)local_40);
  }
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&entry_returned,&this->dispatch_mutex_);
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_map<XrGeometryInstanceFB_T_*,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>,_std::hash<XrGeometryInstanceFB_T_*>,_std::equal_to<XrGeometryInstanceFB_T_*>,_std::allocator<std::pair<XrGeometryInstanceFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>_>
       ::find(&this->info_map_,(key_type *)&info_local);
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<XrGeometryInstanceFB_T_*,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>,_std::hash<XrGeometryInstanceFB_T_*>,_std::equal_to<XrGeometryInstanceFB_T_*>,_std::allocator<std::pair<XrGeometryInstanceFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>_>
       ::end(&this->info_map_);
  bVar2 = std::__detail::operator!=(&local_70,&local_78);
  puVar1 = local_20;
  if (!bVar2) {
    this_00 = std::
              unordered_map<XrGeometryInstanceFB_T_*,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>,_std::hash<XrGeometryInstanceFB_T_*>,_std::equal_to<XrGeometryInstanceFB_T_*>,_std::allocator<std::pair<XrGeometryInstanceFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>_>
              ::operator[](&this->info_map_,(key_type *)&info_local);
    std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>::
    operator=(this_00,puVar1);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&entry_returned);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,"Handle passed to HandleInfoBase::insert() already inserted",&local_99);
  reportInternalError((string *)local_98);
}

Assistant:

inline void HandleInfoBase<HandleType, InfoType>::insert(HandleType handle, std::unique_ptr<InfoType> &&info) {
    if (handle == XR_NULL_HANDLE) {
        reportInternalError("Null handle passed to HandleInfoBase::insert()");
    }
    UniqueLock lock(dispatch_mutex_);
    auto entry_returned = info_map_.find(handle);
    if (entry_returned != info_map_.end()) {
        reportInternalError("Handle passed to HandleInfoBase::insert() already inserted");
    }
    info_map_[handle] = std::move(info);
}